

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWindowsRegistry.cxx
# Opt level: O0

bool __thiscall anon_unknown.dwarf_11dcfda::ExpressionParser::Find(ExpressionParser *this)

{
  string_view l;
  bool bVar1;
  int iVar2;
  long lVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  static_string_view sVar9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  size_t local_100;
  char *local_f8;
  size_t local_f0;
  char *local_e8;
  size_t local_e0;
  char *local_d8;
  string_view local_d0;
  size_t local_c0;
  char *local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  size_t local_a0;
  size_t local_98;
  size_type local_90;
  size_type pos;
  char *local_80;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined1 local_58 [8];
  string_view separator;
  undefined1 auStack_40 [7];
  bool result;
  char *local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  ExpressionParser *local_10;
  ExpressionParser *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20);
  (this->RootKey)._M_len = local_20._M_len;
  (this->RootKey)._M_str = local_20._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30);
  (this->SubKey)._M_len = local_30._M_len;
  (this->SubKey)._M_str = local_30._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_40);
  (this->ValueName)._M_len = _auStack_40;
  (this->ValueName)._M_str = local_38;
  separator._M_str._7_1_ = cmsys::RegularExpression::find(&this->RegistryFormat,&this->Expression);
  if ((bool)separator._M_str._7_1_) {
    lVar3 = std::__cxx11::string::data();
    sVar4 = cmsys::RegularExpression::start(&this->RegistryFormat,1);
    sVar5 = cmsys::RegularExpression::end(&this->RegistryFormat,1);
    sVar6 = cmsys::RegularExpression::start(&this->RegistryFormat,1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_58,(char *)(lVar3 + sVar4),
               sVar5 - sVar6);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_58);
    if (bVar1) {
      local_58 = (undefined1  [8])(this->Separator)._M_len;
      separator._M_len = (size_t)(this->Separator)._M_str;
    }
    else {
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_58);
      local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_58,1,sVar7 - 2
                           );
      local_58 = (undefined1  [8])local_68._M_len;
      separator._M_len = (size_t)local_68._M_str;
    }
    lVar3 = std::__cxx11::string::data();
    sVar4 = cmsys::RegularExpression::start(&this->RegistryFormat,2);
    sVar5 = cmsys::RegularExpression::end(&this->RegistryFormat,2);
    sVar6 = cmsys::RegularExpression::start(&this->RegistryFormat,2);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,(char *)(lVar3 + sVar4),sVar5 - sVar6);
    (this->RootKey)._M_len = local_78._M_len;
    (this->RootKey)._M_str = local_78._M_str;
    lVar3 = std::__cxx11::string::data();
    sVar4 = cmsys::RegularExpression::start(&this->RegistryFormat,3);
    sVar5 = cmsys::RegularExpression::end(&this->RegistryFormat,3);
    sVar6 = cmsys::RegularExpression::start(&this->RegistryFormat,3);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&pos,(char *)(lVar3 + sVar4),
               sVar5 - sVar6);
    (this->SubKey)._M_len = pos;
    (this->SubKey)._M_str = local_80;
    local_a0 = (size_t)local_58;
    local_98 = separator._M_len;
    bVar10._M_str = (char *)separator._M_len;
    bVar10._M_len = (size_t)local_58;
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find(&this->SubKey,bVar10,0);
    local_90 = sVar8;
    if (sVar8 == 0xffffffffffffffff) {
      sVar9 = ::cm::operator____s("",0);
      local_100 = sVar9.super_string_view._M_len;
      (this->ValueName)._M_len = local_100;
      local_f8 = sVar9.super_string_view._M_str;
      (this->ValueName)._M_str = local_f8;
    }
    else {
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_58);
      local_b0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&this->SubKey,sVar8 + sVar7,0xffffffffffffffff);
      (this->ValueName)._M_len = local_b0._M_len;
      (this->ValueName)._M_str = local_b0._M_str;
      local_c0 = (this->ValueName)._M_len;
      local_b8 = (this->ValueName)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_d0,"(default)");
      l._M_str = local_b8;
      l._M_len = local_c0;
      iVar2 = Strucmp(l,local_d0);
      if (iVar2 == 0) {
        sVar9 = ::cm::operator____s("",0);
        local_e0 = sVar9.super_string_view._M_len;
        (this->ValueName)._M_len = local_e0;
        local_d8 = sVar9.super_string_view._M_str;
        (this->ValueName)._M_str = local_d8;
      }
      bVar10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&this->SubKey,0,local_90);
      local_f0 = bVar10._M_len;
      (this->SubKey)._M_len = local_f0;
      local_e8 = bVar10._M_str;
      (this->SubKey)._M_str = local_e8;
    }
  }
  return (bool)(separator._M_str._7_1_ & 1);
}

Assistant:

bool Find()
  {
    // reset result members
    this->RootKey = cm::string_view{};
    this->SubKey = cm::string_view{};
    this->ValueName = cm::string_view{};

    auto result = this->RegistryFormat.find(this->Expression);

    if (result) {
      auto separator = cm::string_view{
        this->Expression.data() + this->RegistryFormat.start(1),
        this->RegistryFormat.end(1) - this->RegistryFormat.start(1)
      };
      if (separator.empty()) {
        separator = this->Separator;
      } else {
        separator = separator.substr(1, separator.length() - 2);
      }

      this->RootKey = cm::string_view{
        this->Expression.data() + this->RegistryFormat.start(2),
        this->RegistryFormat.end(2) - this->RegistryFormat.start(2)
      };
      this->SubKey = cm::string_view{
        this->Expression.data() + this->RegistryFormat.start(3),
        this->RegistryFormat.end(3) - this->RegistryFormat.start(3)
      };

      auto pos = this->SubKey.find(separator);
      if (pos != cm::string_view::npos) {
        // split in ValueName and SubKey
        this->ValueName = this->SubKey.substr(pos + separator.size());
        if (Strucmp(this->ValueName, "(default)") == 0) {
          // handle magic name for default value
          this->ValueName = ""_s;
        }
        this->SubKey = this->SubKey.substr(0, pos);
      } else {
        this->ValueName = ""_s;
      }
    }
    return result;
  }